

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void unquote(string *v)

{
  string local_30 [32];
  string *local_10;
  string *v_local;
  
  local_10 = v;
  std::__cxx11::string::length();
  std::__cxx11::string::substr((ulong)local_30,(ulong)v);
  std::__cxx11::string::operator=((string *)local_10,local_30);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void unquote(std::string& v)
{
    v = v.substr(1, v.length() - 2);
}